

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void nni_http_del_header(nng_http *conn,char *key)

{
  int iVar1;
  http_header *h;
  nni_list *list;
  
  list = &(conn->res).data.hdrs;
  if (conn->client != false) {
    list = &(conn->req).data.hdrs;
  }
  do {
    h = (http_header *)nni_list_first(list);
    while( true ) {
      if (h == (http_header *)0x0) {
        return;
      }
      iVar1 = nni_strcasecmp(key,h->name);
      if (iVar1 == 0) break;
      h = (http_header *)nni_list_next(list,h);
    }
    nni_http_free_header(h);
  } while( true );
}

Assistant:

void
nni_http_del_header(nng_http *conn, const char *key)
{
	nni_list *hdrs =
	    conn->client ? &conn->req.data.hdrs : &conn->res.data.hdrs;
	while (http_del_header_one(hdrs, key)) {
		continue;
	}
}